

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_get_bit_depth(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar2 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar2 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar2 + 1;
  }
  if ((undefined4 *)*puVar2 != (undefined4 *)0x0) {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      *(undefined4 *)*puVar2 = *(undefined4 *)(*(long *)(*ctx->frame_worker->data1 + 0x9be8) + 0x48)
      ;
      return AOM_CODEC_OK;
    }
    return AOM_CODEC_ERROR;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_get_bit_depth(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  unsigned int *const bit_depth = va_arg(args, unsigned int *);
  AVxWorker *const worker = ctx->frame_worker;

  if (bit_depth) {
    if (worker) {
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1_COMMON *const cm = &frame_worker_data->pbi->common;
      *bit_depth = cm->seq_params->bit_depth;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}